

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSpaceVelocityData *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  ulong __val;
  char cVar4;
  bool bVar5;
  char *pcVar6;
  invalid_argument *piVar7;
  long lVar8;
  ulong uVar9;
  char cVar10;
  XrGeneratedDispatchTable *pXVar11;
  string linearvelocity_prefix;
  string velocityflags_prefix;
  string angularvelocity_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  paVar1 = &local_f0.field_2;
  local_110._M_dataplus._M_p = (pointer)value;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_f0,'\x12');
  *local_f0._M_dataplus._M_p = '0';
  local_f0._M_dataplus._M_p[1] = 'x';
  pcVar6 = local_f0._M_dataplus._M_p + (local_f0._M_string_length - 1);
  lVar8 = 0;
  do {
    bVar2 = *(byte *)((long)&local_110._M_dataplus._M_p + lVar8);
    *pcVar6 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar6[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar8 = lVar8 + 1;
    pcVar6 = pcVar6 + -2;
  } while (lVar8 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  pcVar3 = (prefix->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_f0);
  __val = value->velocityFlags;
  cVar10 = '\x01';
  if (9 < __val) {
    uVar9 = __val;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (uVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0015d17e;
      }
      if (uVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0015d17e;
      }
      if (uVar9 < 10000) goto LAB_0015d17e;
      bVar5 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar5);
    cVar10 = cVar10 + '\x01';
  }
LAB_0015d17e:
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_110,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_110._M_dataplus._M_p,(uint)local_110._M_string_length,__val);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[21],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [21])"XrSpaceVelocityFlags",&local_f0,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_110);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_110._M_dataplus._M_p,
             local_110._M_dataplus._M_p +
             CONCAT44(local_110._M_string_length._4_4_,(uint)local_110._M_string_length));
  pXVar11 = (XrGeneratedDispatchTable *)local_70;
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar11,"XrVector3f","");
  bVar5 = ApiDumpOutputXrStruct
                    (pXVar11,&value->linearVelocity,&local_50,(string *)local_70,false,contents);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,(ulong)(local_60._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Invalid Operation");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar3 = (prefix->_M_dataplus)._M_p;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_d0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_d0,local_c8 + (long)local_d0);
  pXVar11 = (XrGeneratedDispatchTable *)local_b0;
  local_b0._0_8_ = local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar11,"XrVector3f","");
  bVar5 = ApiDumpOutputXrStruct
                    (pXVar11,&value->angularVelocity,&local_90,(string *)local_b0,false,contents);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_a0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar7,"Invalid Operation");
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpaceVelocityData* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string velocityflags_prefix = prefix;
        velocityflags_prefix += "velocityFlags";
        contents.emplace_back("XrSpaceVelocityFlags", velocityflags_prefix, std::to_string(value->velocityFlags));
        std::string linearvelocity_prefix = prefix;
        linearvelocity_prefix += "linearVelocity";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->linearVelocity, linearvelocity_prefix, "XrVector3f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string angularvelocity_prefix = prefix;
        angularvelocity_prefix += "angularVelocity";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->angularVelocity, angularvelocity_prefix, "XrVector3f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}